

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::ValueRangeExpression::serializeTo(ValueRangeExpression *this,ASTSerializer *serializer)

{
  size_t __n;
  
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  __n = strlen(*(char **)(toString(slang::ast::ValueRangeKind)::strings +
                         (long)(int)this->rangeKind * 8));
  ASTSerializer::write(serializer,9,"rangeKind",__n);
  return;
}

Assistant:

void ValueRangeExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());
    serializer.write("right", right());
    serializer.write("rangeKind", toString(rangeKind));
}